

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void chacha20_inner_block(uint32_t *state)

{
  uint32_t *state_local;
  
  chacha20_quarter_round(state,0,4,8,0xc);
  chacha20_quarter_round(state,1,5,9,0xd);
  chacha20_quarter_round(state,2,6,10,0xe);
  chacha20_quarter_round(state,3,7,0xb,0xf);
  chacha20_quarter_round(state,0,5,10,0xf);
  chacha20_quarter_round(state,1,6,0xb,0xc);
  chacha20_quarter_round(state,2,7,8,0xd);
  chacha20_quarter_round(state,3,4,9,0xe);
  return;
}

Assistant:

static void chacha20_inner_block( uint32_t state[16] )
{
    chacha20_quarter_round( state, 0, 4, 8,  12 );
    chacha20_quarter_round( state, 1, 5, 9,  13 );
    chacha20_quarter_round( state, 2, 6, 10, 14 );
    chacha20_quarter_round( state, 3, 7, 11, 15 );

    chacha20_quarter_round( state, 0, 5, 10, 15 );
    chacha20_quarter_round( state, 1, 6, 11, 12 );
    chacha20_quarter_round( state, 2, 7, 8,  13 );
    chacha20_quarter_round( state, 3, 4, 9,  14 );
}